

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QNetworkProxy *proxy)

{
  long lVar1;
  ushort uVar2;
  long *plVar3;
  long *in_RDX;
  int iVar4;
  uint uVar5;
  storage_type *psVar6;
  undefined8 *puVar7;
  char16_t *pcVar8;
  QNetworkProxyPrivate *pQVar9;
  QArrayData *pQVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QDebugStateSaver saver;
  QString local_78;
  undefined1 *local_60;
  QArrayDataPointer<QString> local_58;
  undefined2 local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_60,(QDebug *)proxy);
  plVar3 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar3 + 0x30) = 0;
  if (*in_RDX == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = *(int *)(*in_RDX + 0x58);
  }
  pQVar9 = (proxy->d).d.ptr;
  switch(iVar4) {
  case 0:
    psVar6 = (storage_type *)0xd;
    break;
  case 1:
    psVar6 = (storage_type *)0xc;
    break;
  case 2:
    psVar6 = (storage_type *)0x8;
    break;
  case 3:
    psVar6 = (storage_type *)0xa;
    break;
  case 4:
    psVar6 = (storage_type *)0x11;
    break;
  case 5:
    psVar6 = (storage_type *)0x10;
    break;
  default:
    QVar13.m_data = (storage_type *)0xe;
    QVar13.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)pQVar9,(QString *)&local_58);
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar9 = (proxy->d).d.ptr;
    if ((char)(pQVar9->user).d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar9,' ');
    }
    QTextStream::operator<<((QTextStream *)(proxy->d).d.ptr,iVar4);
    pQVar9 = (proxy->d).d.ptr;
    if ((char)(pQVar9->user).d.size != '\x01') goto LAB_001beeb8;
    goto LAB_001beeae;
  }
  QVar11.m_data = psVar6;
  QVar11.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar11);
  QTextStream::operator<<((QTextStream *)pQVar9,(QString *)&local_58);
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar9 = (proxy->d).d.ptr;
  if ((char)(pQVar9->user).d.size != '\0') {
LAB_001beeae:
    QTextStream::operator<<((QTextStream *)pQVar9,' ');
  }
LAB_001beeb8:
  QTextStream::operator<<((QTextStream *)(proxy->d).d.ptr,'\"');
  pQVar9 = (proxy->d).d.ptr;
  if ((char)(pQVar9->user).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar9,' ');
  }
  lVar1 = *in_RDX;
  if (lVar1 == 0) {
    puVar7 = (undefined8 *)0x0;
    pQVar10 = (QArrayData *)0x0;
  }
  else {
    pQVar10 = *(QArrayData **)(lVar1 + 8);
    puVar7 = *(undefined8 **)(lVar1 + 0x10);
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (puVar7 == (undefined8 *)0x0) {
    puVar7 = &QString::_empty;
  }
  QDebug::putString((QChar *)proxy,(ulong)puVar7);
  pQVar9 = (proxy->d).d.ptr;
  if ((char)(pQVar9->user).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar9,' ');
  }
  QTextStream::operator<<((QTextStream *)(proxy->d).d.ptr,':');
  pQVar9 = (proxy->d).d.ptr;
  if ((char)(pQVar9->user).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar9,' ');
  }
  if (*in_RDX == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ushort *)(*in_RDX + 0x54);
  }
  QTextStream::operator<<((QTextStream *)(proxy->d).d.ptr,uVar2);
  pQVar9 = (proxy->d).d.ptr;
  if ((char)(pQVar9->user).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar9,' ');
  }
  pQVar9 = (proxy->d).d.ptr;
  QVar12.m_data = (storage_type *)0x2;
  QVar12.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar12);
  QTextStream::operator<<((QTextStream *)pQVar9,(QString *)&local_58);
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar9 = (proxy->d).d.ptr;
  if ((char)(pQVar9->user).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar9,' ');
  }
  if (pQVar10 != (QArrayData *)0x0) {
    LOCK();
    (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar10,2,0x10);
    }
  }
  if (*in_RDX == 0) {
    uVar5 = 0x67;
  }
  else {
    uVar5 = *(uint *)(*in_RDX + 0x50);
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  if ((uVar5 & 1) != 0) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"Tunnel";
    local_78.d.size = 6;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_58,0,&local_78);
    QList<QString>::end((QList<QString> *)&local_58);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((uVar5 & 2) != 0) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"Listen";
    local_78.d.size = 6;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
    QList<QString>::end((QList<QString> *)&local_58);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((uVar5 & 4) != 0) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"UDP";
    local_78.d.size = 3;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
    QList<QString>::end((QList<QString> *)&local_58);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((uVar5 & 8) != 0) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"Caching";
    local_78.d.size = 7;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
    QList<QString>::end((QList<QString> *)&local_58);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((uVar5 & 0x10) != 0) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"NameLookup";
    local_78.d.size = 10;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
    QList<QString>::end((QList<QString> *)&local_58);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((uVar5 & 0x20) != 0) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"SctpTunnel";
    local_78.d.size = 10;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
    QList<QString>::end((QList<QString> *)&local_58);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((uVar5 & 0x40) != 0) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"SctpListen";
    local_78.d.size = 10;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
    QList<QString>::end((QList<QString> *)&local_58);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QTextStream::operator<<((QTextStream *)(proxy->d).d.ptr,'[');
  pQVar9 = (proxy->d).d.ptr;
  if ((char)(pQVar9->user).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar9,' ');
  }
  local_3a = 0x20;
  QtPrivate::QStringList_join((QList *)&local_78,(QChar *)&local_58,(longlong)&local_3a);
  pcVar8 = local_78.d.ptr;
  if (local_78.d.ptr == (char16_t *)0x0) {
    pcVar8 = (char16_t *)&QString::_empty;
  }
  QDebug::putString((QChar *)proxy,(ulong)pcVar8);
  pQVar9 = (proxy->d).d.ptr;
  if ((char)(pQVar9->user).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar9,' ');
  }
  QTextStream::operator<<((QTextStream *)(proxy->d).d.ptr,']');
  pQVar9 = (proxy->d).d.ptr;
  if ((char)(pQVar9->user).d.size == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar9,' ');
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar9 = (proxy->d).d.ptr;
  (proxy->d).d.ptr = (QNetworkProxyPrivate *)0x0;
  *(QNetworkProxyPrivate **)debug.stream = pQVar9;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)debug.stream;
}

Assistant:

QDebug operator<<(QDebug debug, const QNetworkProxy &proxy)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    QNetworkProxy::ProxyType type = proxy.type();
    switch (type) {
    case QNetworkProxy::NoProxy:
        debug << "NoProxy ";
        break;
    case QNetworkProxy::DefaultProxy:
        debug << "DefaultProxy ";
        break;
    case QNetworkProxy::Socks5Proxy:
        debug << "Socks5Proxy ";
        break;
    case QNetworkProxy::HttpProxy:
        debug << "HttpProxy ";
        break;
    case QNetworkProxy::HttpCachingProxy:
        debug << "HttpCachingProxy ";
        break;
    case QNetworkProxy::FtpCachingProxy:
        debug << "FtpCachingProxy ";
        break;
    default:
        debug << "Unknown proxy " << int(type);
        break;
    }
    debug << '"' << proxy.hostName() << ':' << proxy.port() << "\" ";
    QNetworkProxy::Capabilities caps = proxy.capabilities();
    QStringList scaps;
    if (caps & QNetworkProxy::TunnelingCapability)
        scaps << QStringLiteral("Tunnel");
    if (caps & QNetworkProxy::ListeningCapability)
        scaps << QStringLiteral("Listen");
    if (caps & QNetworkProxy::UdpTunnelingCapability)
        scaps << QStringLiteral("UDP");
    if (caps & QNetworkProxy::CachingCapability)
        scaps << QStringLiteral("Caching");
    if (caps & QNetworkProxy::HostNameLookupCapability)
        scaps << QStringLiteral("NameLookup");
    if (caps & QNetworkProxy::SctpTunnelingCapability)
        scaps << QStringLiteral("SctpTunnel");
    if (caps & QNetworkProxy::SctpListeningCapability)
        scaps << QStringLiteral("SctpListen");
    debug << '[' << scaps.join(u' ') << ']';
    return debug;
}